

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void add_bulk_impl(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  short sVar1;
  container_t *pcVar2;
  undefined4 in_EDX;
  long *in_RSI;
  roaring_array_t *in_RDI;
  container_t *container2;
  uint8_t new_typecode;
  int idx;
  uint8_t typecode;
  undefined4 in_stack_00000010;
  uint16_t key;
  roaring_bitmap_t *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffe0;
  uint8_t typecode_00;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffe9;
  
  sVar1 = (short)((uint)in_EDX >> 0x10);
  if ((*in_RSI == 0) || (*(short *)((long)in_RSI + 0xc) != sVar1)) {
    pcVar2 = containerptr_roaring_bitmap_add
                       (in_stack_00000028,r._4_4_,(uint8_t *)context,
                        (int *)CONCAT44(val,in_stack_00000010));
    *in_RSI = (long)pcVar2;
    *(undefined1 *)((long)in_RSI + 0xe) = in_stack_ffffffffffffffe9;
    *(undefined4 *)(in_RSI + 1) = in_stack_ffffffffffffffe4;
    *(short *)((long)in_RSI + 0xc) = sVar1;
  }
  else {
    pcVar2 = container_add(in_RDI,(uint16_t)((ulong)in_RSI >> 0x30),(uint8_t)((ulong)in_RSI >> 0x28)
                           ,(uint8_t *)
                            CONCAT44(in_EDX,CONCAT22(sVar1,CONCAT11(in_stack_ffffffffffffffe9,
                                                                    in_stack_ffffffffffffffe8))));
    if (pcVar2 != (container_t *)*in_RSI) {
      container_free((container_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (uint8_t)((ulong)pcVar2 >> 0x38));
      typecode_00 = (uint8_t)((uint)in_stack_ffffffffffffffe0 >> 0x18);
      ra_set_container_at_index(in_RDI,(int32_t)in_RSI[1],pcVar2,typecode_00);
      *(uint8_t *)((long)in_RSI + 0xe) = typecode_00;
      *in_RSI = (long)pcVar2;
    }
  }
  return;
}

Assistant:

static inline void add_bulk_impl(roaring_bitmap_t *r,
                                 roaring_bulk_context_t *context,
                                 uint32_t val) {
    uint16_t key = val >> 16;
    if (context->container == NULL || context->key != key) {
        uint8_t typecode;
        int idx;
        context->container =
            containerptr_roaring_bitmap_add(r, val, &typecode, &idx);
        context->typecode = typecode;
        context->idx = idx;
        context->key = key;
    } else {
        // no need to seek the container, it is at hand
        // because we already have the container at hand, we can do the
        // insertion directly, bypassing the roaring_bitmap_add call
        uint8_t new_typecode;
        container_t *container2 = container_add(
            context->container, val & 0xFFFF, context->typecode, &new_typecode);
        if (container2 != context->container) {
            // rare instance when we need to change the container type
            container_free(context->container, context->typecode);
            ra_set_container_at_index(&r->high_low_container, context->idx,
                                      container2, new_typecode);
            context->typecode = new_typecode;
            context->container = container2;
        }
    }
}